

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::TestCaseInfo::internalAppendTag(TestCaseInfo *this,StringRef tagStr)

{
  size_type sVar1;
  size_type sVar2;
  char cVar3;
  StringRef local_38;
  
  cVar3 = (char)&this->backingTags;
  std::__cxx11::string::push_back(cVar3);
  sVar1 = (this->backingTags)._M_string_length;
  std::__cxx11::string::append((char *)&this->backingTags,(ulong)tagStr.m_start);
  sVar2 = (this->backingTags)._M_string_length;
  std::__cxx11::string::push_back(cVar3);
  local_38.m_size = sVar2 - sVar1;
  local_38.m_start = (this->backingTags)._M_dataplus._M_p + sVar1;
  std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::emplace_back<Catch::StringRef>
            (&this->tags,&local_38);
  return;
}

Assistant:

void TestCaseInfo::internalAppendTag(StringRef tagStr) {
        backingTags += '[';
        const auto backingStart = backingTags.size();
        backingTags += tagStr;
        const auto backingEnd = backingTags.size();
        backingTags += ']';
        tags.emplace_back(StringRef(backingTags.c_str() + backingStart, backingEnd - backingStart));
    }